

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# views_pool.cpp
# Opt level: O0

void __thiscall cppcms::views::manager::data::data(data *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::vector<cppcms::views::impl::skin,_std::allocator<cppcms::views::impl::skin>_>::vector
            ((vector<cppcms::views::impl::skin,_std::allocator<cppcms::views::impl::skin>_> *)
             0x3d2df7);
  booster::recursive_shared_mutex::recursive_shared_mutex((recursive_shared_mutex *)(in_RDI + 0x40))
  ;
  return;
}

Assistant:

data() : auto_reload(false) 
	{
	}